

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

uintwide_t<512U,_unsigned_int,_void,_false> * __thiscall
math::wide_integer::gcd<512u,unsigned_int,void,false>
          (uintwide_t<512U,_unsigned_int,_void,_false> *__return_storage_ptr__,wide_integer *this,
          uintwide_t<512U,_unsigned_int,_void,_false> *a,
          uintwide_t<512U,_unsigned_int,_void,_false> *b)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  bool bVar17;
  enable_if_t<std::is_integral<unsigned_int>::value,_bool> eVar18;
  enable_if_t<std::is_integral<unsigned_long>::value,_bool> eVar19;
  unsigned_fast_type n;
  unsigned_fast_type n_00;
  unsigned_long v_00;
  unsigned_fast_type n_01;
  local_wide_integer_type u;
  local_wide_integer_type v;
  uintwide_t<512U,_unsigned_int,_void,_false> local_138;
  uintwide_t<512U,_unsigned_int,_void,_false> local_f8;
  undefined8 local_b8;
  value_type_conflict vStack_b0;
  value_type_conflict vStack_ac;
  value_type_conflict local_a8;
  value_type_conflict vStack_a4;
  value_type_conflict vStack_a0;
  value_type_conflict vStack_9c;
  value_type_conflict local_98;
  value_type_conflict vStack_94;
  value_type_conflict vStack_90;
  value_type_conflict vStack_8c;
  value_type_conflict local_88;
  value_type_conflict vStack_84;
  value_type_conflict vStack_80;
  value_type_conflict vStack_7c;
  
  local_138.values.super_array<unsigned_int,_16UL>.elems._0_8_ = *(undefined8 *)this;
  local_138.values.super_array<unsigned_int,_16UL>.elems._8_8_ = *(undefined8 *)(this + 8);
  local_138.values.super_array<unsigned_int,_16UL>.elems._16_8_ = *(undefined8 *)(this + 0x10);
  local_138.values.super_array<unsigned_int,_16UL>.elems._24_8_ = *(undefined8 *)(this + 0x18);
  local_138.values.super_array<unsigned_int,_16UL>.elems._32_8_ = *(undefined8 *)(this + 0x20);
  local_138.values.super_array<unsigned_int,_16UL>.elems._40_8_ = *(undefined8 *)(this + 0x28);
  local_138.values.super_array<unsigned_int,_16UL>.elems._48_8_ = *(undefined8 *)(this + 0x30);
  local_138.values.super_array<unsigned_int,_16UL>.elems._56_8_ = *(undefined8 *)(this + 0x38);
  local_f8.values.super_array<unsigned_int,_16UL>.elems._0_8_ =
       *(undefined8 *)(a->values).super_array<unsigned_int,_16UL>.elems;
  local_f8.values.super_array<unsigned_int,_16UL>.elems._8_8_ =
       *(undefined8 *)((a->values).super_array<unsigned_int,_16UL>.elems + 2);
  local_f8.values.super_array<unsigned_int,_16UL>.elems._16_8_ =
       *(undefined8 *)((a->values).super_array<unsigned_int,_16UL>.elems + 4);
  local_f8.values.super_array<unsigned_int,_16UL>.elems._24_8_ =
       *(undefined8 *)((a->values).super_array<unsigned_int,_16UL>.elems + 6);
  local_f8.values.super_array<unsigned_int,_16UL>.elems._32_8_ =
       *(undefined8 *)((a->values).super_array<unsigned_int,_16UL>.elems + 8);
  local_f8.values.super_array<unsigned_int,_16UL>.elems._40_8_ =
       *(undefined8 *)((a->values).super_array<unsigned_int,_16UL>.elems + 10);
  local_f8.values.super_array<unsigned_int,_16UL>.elems._48_8_ =
       *(undefined8 *)((a->values).super_array<unsigned_int,_16UL>.elems + 0xc);
  local_f8.values.super_array<unsigned_int,_16UL>.elems._56_8_ =
       *(undefined8 *)((a->values).super_array<unsigned_int,_16UL>.elems + 0xe);
  uintwide_t<512U,_unsigned_int,_void,_false>::uintwide_t(__return_storage_ptr__);
  bVar17 = uintwide_t<512U,_unsigned_int,_void,_false>::operator==(&local_138,&local_f8);
  if (bVar17) {
LAB_0019d6de:
  }
  else {
    if (local_f8.values.super_array<unsigned_int,_16UL>.elems[0] == 0) {
      local_b8 = local_b8 & 0xffffffff00000000;
      eVar18 = operator==(&local_f8,(uint *)&local_b8);
      if (eVar18) goto LAB_0019d6de;
    }
    if (local_138.values.super_array<unsigned_int,_16UL>.elems[0] == 0) {
      local_b8 = local_b8 & 0xffffffff00000000;
      eVar18 = operator==(&local_138,(uint *)&local_b8);
      if (eVar18) {
        local_138.values.super_array<unsigned_int,_16UL>.elems[0] =
             local_f8.values.super_array<unsigned_int,_16UL>.elems[0];
        local_138.values.super_array<unsigned_int,_16UL>.elems[1] =
             local_f8.values.super_array<unsigned_int,_16UL>.elems[1];
        local_138.values.super_array<unsigned_int,_16UL>.elems[2] =
             local_f8.values.super_array<unsigned_int,_16UL>.elems[2];
        local_138.values.super_array<unsigned_int,_16UL>.elems[3] =
             local_f8.values.super_array<unsigned_int,_16UL>.elems[3];
        local_138.values.super_array<unsigned_int,_16UL>.elems[4] =
             local_f8.values.super_array<unsigned_int,_16UL>.elems[4];
        local_138.values.super_array<unsigned_int,_16UL>.elems[5] =
             local_f8.values.super_array<unsigned_int,_16UL>.elems[5];
        local_138.values.super_array<unsigned_int,_16UL>.elems[6] =
             local_f8.values.super_array<unsigned_int,_16UL>.elems[6];
        local_138.values.super_array<unsigned_int,_16UL>.elems[7] =
             local_f8.values.super_array<unsigned_int,_16UL>.elems[7];
        local_138.values.super_array<unsigned_int,_16UL>.elems[8] =
             local_f8.values.super_array<unsigned_int,_16UL>.elems[8];
        local_138.values.super_array<unsigned_int,_16UL>.elems[9] =
             local_f8.values.super_array<unsigned_int,_16UL>.elems[9];
        local_138.values.super_array<unsigned_int,_16UL>.elems[10] =
             local_f8.values.super_array<unsigned_int,_16UL>.elems[10];
        local_138.values.super_array<unsigned_int,_16UL>.elems[0xb] =
             local_f8.values.super_array<unsigned_int,_16UL>.elems[0xb];
        local_138.values.super_array<unsigned_int,_16UL>.elems[0xc] =
             local_f8.values.super_array<unsigned_int,_16UL>.elems[0xc];
        local_138.values.super_array<unsigned_int,_16UL>.elems[0xd] =
             local_f8.values.super_array<unsigned_int,_16UL>.elems[0xd];
        local_138.values.super_array<unsigned_int,_16UL>.elems[0xe] =
             local_f8.values.super_array<unsigned_int,_16UL>.elems[0xe];
        local_138.values.super_array<unsigned_int,_16UL>.elems[0xf] =
             local_f8.values.super_array<unsigned_int,_16UL>.elems[0xf];
        goto LAB_0019d8a3;
      }
    }
    n = lsb<512u,unsigned_int,void,false>(&local_138);
    n_00 = lsb<512u,unsigned_int,void,false>(&local_f8);
    n_01 = n_00;
    if (n <= n_00) {
      n_01 = n;
    }
    uintwide_t<512u,unsigned_int,void,false>::operator>>=
              ((uintwide_t<512u,unsigned_int,void,false> *)&local_138,n);
    while( true ) {
      uintwide_t<512u,unsigned_int,void,false>::operator>>=
                ((uintwide_t<512u,unsigned_int,void,false> *)&local_f8,n_00);
      bVar17 = uintwide_t<512U,_unsigned_int,_void,_false>::operator>(&local_138,&local_f8);
      uVar15 = local_138.values.super_array<unsigned_int,_16UL>.elems._56_8_;
      uVar13 = local_138.values.super_array<unsigned_int,_16UL>.elems._48_8_;
      uVar11 = local_138.values.super_array<unsigned_int,_16UL>.elems._40_8_;
      uVar9 = local_138.values.super_array<unsigned_int,_16UL>.elems._32_8_;
      uVar7 = local_138.values.super_array<unsigned_int,_16UL>.elems._24_8_;
      uVar5 = local_138.values.super_array<unsigned_int,_16UL>.elems._16_8_;
      uVar3 = local_138.values.super_array<unsigned_int,_16UL>.elems._8_8_;
      uVar1 = local_138.values.super_array<unsigned_int,_16UL>.elems._0_8_;
      if (bVar17) {
        local_138.values.super_array<unsigned_int,_16UL>.elems[0] =
             local_f8.values.super_array<unsigned_int,_16UL>.elems[0];
        local_138.values.super_array<unsigned_int,_16UL>.elems[1] =
             local_f8.values.super_array<unsigned_int,_16UL>.elems[1];
        uVar2 = local_138.values.super_array<unsigned_int,_16UL>.elems._0_8_;
        local_138.values.super_array<unsigned_int,_16UL>.elems[2] =
             local_f8.values.super_array<unsigned_int,_16UL>.elems[2];
        local_138.values.super_array<unsigned_int,_16UL>.elems[3] =
             local_f8.values.super_array<unsigned_int,_16UL>.elems[3];
        uVar4 = local_138.values.super_array<unsigned_int,_16UL>.elems._8_8_;
        local_138.values.super_array<unsigned_int,_16UL>.elems[4] =
             local_f8.values.super_array<unsigned_int,_16UL>.elems[4];
        local_138.values.super_array<unsigned_int,_16UL>.elems[5] =
             local_f8.values.super_array<unsigned_int,_16UL>.elems[5];
        uVar6 = local_138.values.super_array<unsigned_int,_16UL>.elems._16_8_;
        local_138.values.super_array<unsigned_int,_16UL>.elems[6] =
             local_f8.values.super_array<unsigned_int,_16UL>.elems[6];
        local_138.values.super_array<unsigned_int,_16UL>.elems[7] =
             local_f8.values.super_array<unsigned_int,_16UL>.elems[7];
        uVar8 = local_138.values.super_array<unsigned_int,_16UL>.elems._24_8_;
        local_138.values.super_array<unsigned_int,_16UL>.elems[8] =
             local_f8.values.super_array<unsigned_int,_16UL>.elems[8];
        local_138.values.super_array<unsigned_int,_16UL>.elems[9] =
             local_f8.values.super_array<unsigned_int,_16UL>.elems[9];
        uVar10 = local_138.values.super_array<unsigned_int,_16UL>.elems._32_8_;
        local_138.values.super_array<unsigned_int,_16UL>.elems[10] =
             local_f8.values.super_array<unsigned_int,_16UL>.elems[10];
        local_138.values.super_array<unsigned_int,_16UL>.elems[0xb] =
             local_f8.values.super_array<unsigned_int,_16UL>.elems[0xb];
        uVar12 = local_138.values.super_array<unsigned_int,_16UL>.elems._40_8_;
        local_138.values.super_array<unsigned_int,_16UL>.elems[0xc] =
             local_f8.values.super_array<unsigned_int,_16UL>.elems[0xc];
        local_138.values.super_array<unsigned_int,_16UL>.elems[0xd] =
             local_f8.values.super_array<unsigned_int,_16UL>.elems[0xd];
        uVar14 = local_138.values.super_array<unsigned_int,_16UL>.elems._48_8_;
        local_138.values.super_array<unsigned_int,_16UL>.elems[0xe] =
             local_f8.values.super_array<unsigned_int,_16UL>.elems[0xe];
        local_138.values.super_array<unsigned_int,_16UL>.elems[0xf] =
             local_f8.values.super_array<unsigned_int,_16UL>.elems[0xf];
        uVar16 = local_138.values.super_array<unsigned_int,_16UL>.elems._56_8_;
        local_138.values.super_array<unsigned_int,_16UL>.elems[0] = (value_type_conflict)uVar1;
        local_138.values.super_array<unsigned_int,_16UL>.elems[1] = SUB84(uVar1,4);
        local_f8.values.super_array<unsigned_int,_16UL>.elems[0] =
             local_138.values.super_array<unsigned_int,_16UL>.elems[0];
        local_f8.values.super_array<unsigned_int,_16UL>.elems[1] =
             local_138.values.super_array<unsigned_int,_16UL>.elems[1];
        local_138.values.super_array<unsigned_int,_16UL>.elems[2] = (value_type_conflict)uVar3;
        local_138.values.super_array<unsigned_int,_16UL>.elems[3] = SUB84(uVar3,4);
        local_f8.values.super_array<unsigned_int,_16UL>.elems[2] =
             local_138.values.super_array<unsigned_int,_16UL>.elems[2];
        local_f8.values.super_array<unsigned_int,_16UL>.elems[3] =
             local_138.values.super_array<unsigned_int,_16UL>.elems[3];
        local_138.values.super_array<unsigned_int,_16UL>.elems[4] = (value_type_conflict)uVar5;
        local_138.values.super_array<unsigned_int,_16UL>.elems[5] = SUB84(uVar5,4);
        local_f8.values.super_array<unsigned_int,_16UL>.elems[4] =
             local_138.values.super_array<unsigned_int,_16UL>.elems[4];
        local_f8.values.super_array<unsigned_int,_16UL>.elems[5] =
             local_138.values.super_array<unsigned_int,_16UL>.elems[5];
        local_138.values.super_array<unsigned_int,_16UL>.elems[6] = (value_type_conflict)uVar7;
        local_138.values.super_array<unsigned_int,_16UL>.elems[7] = SUB84(uVar7,4);
        local_f8.values.super_array<unsigned_int,_16UL>.elems[6] =
             local_138.values.super_array<unsigned_int,_16UL>.elems[6];
        local_f8.values.super_array<unsigned_int,_16UL>.elems[7] =
             local_138.values.super_array<unsigned_int,_16UL>.elems[7];
        local_138.values.super_array<unsigned_int,_16UL>.elems[8] = (value_type_conflict)uVar9;
        local_138.values.super_array<unsigned_int,_16UL>.elems[9] = SUB84(uVar9,4);
        local_f8.values.super_array<unsigned_int,_16UL>.elems[8] =
             local_138.values.super_array<unsigned_int,_16UL>.elems[8];
        local_f8.values.super_array<unsigned_int,_16UL>.elems[9] =
             local_138.values.super_array<unsigned_int,_16UL>.elems[9];
        local_138.values.super_array<unsigned_int,_16UL>.elems[10] = (value_type_conflict)uVar11;
        local_138.values.super_array<unsigned_int,_16UL>.elems[0xb] = SUB84(uVar11,4);
        local_f8.values.super_array<unsigned_int,_16UL>.elems[10] =
             local_138.values.super_array<unsigned_int,_16UL>.elems[10];
        local_f8.values.super_array<unsigned_int,_16UL>.elems[0xb] =
             local_138.values.super_array<unsigned_int,_16UL>.elems[0xb];
        local_138.values.super_array<unsigned_int,_16UL>.elems[0xc] = (value_type_conflict)uVar13;
        local_138.values.super_array<unsigned_int,_16UL>.elems[0xd] = SUB84(uVar13,4);
        local_f8.values.super_array<unsigned_int,_16UL>.elems[0xc] =
             local_138.values.super_array<unsigned_int,_16UL>.elems[0xc];
        local_f8.values.super_array<unsigned_int,_16UL>.elems[0xd] =
             local_138.values.super_array<unsigned_int,_16UL>.elems[0xd];
        local_138.values.super_array<unsigned_int,_16UL>.elems[0xe] = (value_type_conflict)uVar15;
        local_138.values.super_array<unsigned_int,_16UL>.elems[0xf] = SUB84(uVar15,4);
        local_f8.values.super_array<unsigned_int,_16UL>.elems[0xe] =
             local_138.values.super_array<unsigned_int,_16UL>.elems[0xe];
        local_f8.values.super_array<unsigned_int,_16UL>.elems[0xf] =
             local_138.values.super_array<unsigned_int,_16UL>.elems[0xf];
        local_138.values.super_array<unsigned_int,_16UL>.elems._0_8_ = uVar2;
        local_138.values.super_array<unsigned_int,_16UL>.elems._8_8_ = uVar4;
        local_138.values.super_array<unsigned_int,_16UL>.elems._16_8_ = uVar6;
        local_138.values.super_array<unsigned_int,_16UL>.elems._24_8_ = uVar8;
        local_138.values.super_array<unsigned_int,_16UL>.elems._32_8_ = uVar10;
        local_138.values.super_array<unsigned_int,_16UL>.elems._40_8_ = uVar12;
        local_138.values.super_array<unsigned_int,_16UL>.elems._48_8_ = uVar14;
        local_138.values.super_array<unsigned_int,_16UL>.elems._56_8_ = uVar16;
      }
      bVar17 = uintwide_t<512U,_unsigned_int,_void,_false>::operator==(&local_138,&local_f8);
      if (bVar17) goto LAB_0019d87a;
      local_b8 = 0xffffffffffffffff;
      eVar19 = operator<=(&local_f8,&local_b8);
      if (eVar19) break;
      uintwide_t<512U,_unsigned_int,_void,_false>::operator-=
                (&local_f8,(uintwide_t<24U,_unsigned_char,_void,_false> *)&local_138);
      n_00 = lsb<512u,unsigned_int,void,false>(&local_f8);
    }
    v_00 = std::__detail::__gcd<unsigned_long>
                     (local_f8.values.super_array<unsigned_int,_16UL>.elems._0_8_,
                      local_138.values.super_array<unsigned_int,_16UL>.elems._0_8_);
    uintwide_t<512u,unsigned_int,void,false>::uintwide_t<unsigned_long>(unsigned_long,std::
    enable_if<(std::is_integral<unsigned_long>::value&&std::is_unsigned<unsigned_long>::
    value)&&((std::numeric_limits<unsigned_long>::digits>std::numeric_limits<unsigned_int>::
    digits)),void>::type__
              (&local_b8,v_00,
               (enable_if_t<(std::is_integral<unsigned_long>::value_&&_std::is_unsigned<unsigned_long>::value_&&_(std::numeric_limits<unsigned_long>::digits_>_std__numeric_limits<limb_type>__digits__>
                *)0x0);
    local_138.values.super_array<unsigned_int,_16UL>.elems[3] = vStack_ac;
    local_138.values.super_array<unsigned_int,_16UL>.elems[2] = vStack_b0;
    local_138.values.super_array<unsigned_int,_16UL>.elems[5] = vStack_a4;
    local_138.values.super_array<unsigned_int,_16UL>.elems[4] = local_a8;
    local_138.values.super_array<unsigned_int,_16UL>.elems[7] = vStack_9c;
    local_138.values.super_array<unsigned_int,_16UL>.elems[6] = vStack_a0;
    local_138.values.super_array<unsigned_int,_16UL>.elems[9] = vStack_94;
    local_138.values.super_array<unsigned_int,_16UL>.elems[8] = local_98;
    local_138.values.super_array<unsigned_int,_16UL>.elems[0xb] = vStack_8c;
    local_138.values.super_array<unsigned_int,_16UL>.elems[10] = vStack_90;
    local_138.values.super_array<unsigned_int,_16UL>.elems[0xd] = vStack_84;
    local_138.values.super_array<unsigned_int,_16UL>.elems[0xc] = local_88;
    local_138.values.super_array<unsigned_int,_16UL>.elems[0xf] = vStack_7c;
    local_138.values.super_array<unsigned_int,_16UL>.elems[0xe] = vStack_80;
    local_138.values.super_array<unsigned_int,_16UL>.elems[0] = (value_type_conflict)local_b8;
    local_138.values.super_array<unsigned_int,_16UL>.elems[1] = local_b8._4_4_;
LAB_0019d87a:
    operator<<((wide_integer *)&local_b8,(uintwide_t<24U,_unsigned_char,_void,_false> *)&local_138,
               n_01);
    local_138.values.super_array<unsigned_int,_16UL>.elems[0] = (value_type_conflict)local_b8;
    local_138.values.super_array<unsigned_int,_16UL>.elems[1] = local_b8._4_4_;
    local_138.values.super_array<unsigned_int,_16UL>.elems[2] = vStack_b0;
    local_138.values.super_array<unsigned_int,_16UL>.elems[3] = vStack_ac;
    local_138.values.super_array<unsigned_int,_16UL>.elems[4] = local_a8;
    local_138.values.super_array<unsigned_int,_16UL>.elems[5] = vStack_a4;
    local_138.values.super_array<unsigned_int,_16UL>.elems[6] = vStack_a0;
    local_138.values.super_array<unsigned_int,_16UL>.elems[7] = vStack_9c;
    local_138.values.super_array<unsigned_int,_16UL>.elems[8] = local_98;
    local_138.values.super_array<unsigned_int,_16UL>.elems[9] = vStack_94;
    local_138.values.super_array<unsigned_int,_16UL>.elems[10] = vStack_90;
    local_138.values.super_array<unsigned_int,_16UL>.elems[0xb] = vStack_8c;
    local_138.values.super_array<unsigned_int,_16UL>.elems[0xc] = local_88;
    local_138.values.super_array<unsigned_int,_16UL>.elems[0xd] = vStack_84;
    local_138.values.super_array<unsigned_int,_16UL>.elems[0xe] = vStack_80;
    local_138.values.super_array<unsigned_int,_16UL>.elems[0xf] = vStack_7c;
  }
LAB_0019d8a3:
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[0xc] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[0xc];
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[0xd] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[0xd];
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[0xe] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[0xe];
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[0xf] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[0xf];
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[8] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[8];
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[9] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[9];
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[10] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[10];
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[0xb] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[0xb];
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[4] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[4];
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[5] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[5];
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[6] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[6];
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[7] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[7];
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[0] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[0];
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[1] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[1];
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[2] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[2];
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[3] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[3];
  return __return_storage_ptr__;
}

Assistant:

constexpr auto gcd(const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& a, // NOLINT(readability-function-cognitive-complexity,bugprone-easily-swappable-parameters)
                     const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& b) -> uintwide_t<Width2, LimbType, AllocatorType, IsSigned>
  {
    // This implementation of GCD is an adaptation
    // of existing code from Boost.Multiprecision.

    using local_wide_integer_type = uintwide_t<Width2, LimbType, AllocatorType, IsSigned>;
    using local_ushort_type       = typename local_wide_integer_type::limb_type;
    using local_ularge_type       = typename local_wide_integer_type::double_limb_type;

    const auto u_is_neg = local_wide_integer_type::is_neg(a);
    const auto v_is_neg = local_wide_integer_type::is_neg(b);

    local_wide_integer_type u((!u_is_neg) ? a : -a);
    local_wide_integer_type v((!v_is_neg) ? b : -b);

    local_wide_integer_type result;

    using local_size_type = typename local_wide_integer_type::representation_type::size_type;

    if(u == v)
    { // NOLINT(bugprone-branch-clone)
      // This handles cases having (u = v) and also (u = v = 0).
      result = std::move(u); // LCOV_EXCL_LINE
    }
    else if((static_cast<local_ushort_type>(v) == static_cast<local_ushort_type>(UINT8_C(0))) && (v == static_cast<unsigned>(UINT8_C(0))))
    {
      // This handles cases having (v = 0) with (u != 0).
      result = std::move(u); // LCOV_EXCL_LINE
    }
    else if((static_cast<local_ushort_type>(u) == static_cast<local_ushort_type>(UINT8_C(0))) && (u == static_cast<unsigned>(UINT8_C(0))))
    {
      // This handles cases having (u = 0) with (v != 0).
      result = std::move(v); // LCOV_EXCL_LINE
    }
    else
    {
      // Now we handle cases having (u != 0) and (v != 0).

      // Let shift := lg K, where K is the greatest
      // power of 2 dividing both u and v.

      const unsigned_fast_type u_shift = lsb(u);
      const unsigned_fast_type v_shift = lsb(v);

      const unsigned_fast_type left_shift_amount = (detail::min_unsafe)(u_shift, v_shift);

      u >>= u_shift;
      v >>= v_shift;

      for(;;)
      {
        // Now u and v are both odd, so diff(u, v) is even.
        // Let u = min(u, v), v = diff(u, v) / 2.

        if(u > v)
        {
          swap(u, v);
        }

        if(u == v)
        {
          break;
        }

        if(v <= (std::numeric_limits<local_ularge_type>::max)())
        {
          const auto my_v_hi =
            static_cast<local_ushort_type>
            (
              (v.crepresentation().size() >= static_cast<typename local_wide_integer_type::representation_type::size_type>(UINT8_C(2)))
                ? static_cast<local_ushort_type>(*detail::advance_and_point(v.crepresentation().cbegin(), static_cast<local_size_type>(UINT8_C(1))))
                : static_cast<local_ushort_type>(UINT8_C(0))
            );

          const auto my_u_hi =
            static_cast<local_ushort_type>
            (
              (u.crepresentation().size() >= static_cast<typename local_wide_integer_type::representation_type::size_type>(UINT8_C(2)))
                ? static_cast<local_ushort_type>(*detail::advance_and_point(u.crepresentation().cbegin(), static_cast<local_size_type>(UINT8_C(1))))
                : static_cast<local_ushort_type>(UINT8_C(0))
            );

          const local_ularge_type v_large = detail::make_large(*v.crepresentation().cbegin(), my_v_hi);
          const local_ularge_type u_large = detail::make_large(*u.crepresentation().cbegin(), my_u_hi);

          u = detail::integer_gcd_reduce(v_large, u_large);

          break;
        }

        v  -= u;
        v >>= lsb(v);
      }

      result = (u << left_shift_amount);
    }
   
    if(u_is_neg != v_is_neg)
    {
      result.negate();
    }

    return result;
  }